

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numpy.h
# Opt level: O1

ssize_t __thiscall pybind11::array::shape(array *this,ssize_t dim)

{
  string local_40;
  
  if (*(int *)&(this->super_buffer).super_object.super_handle.m_ptr[1].ob_type <= dim) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"invalid axis","");
    fail_dim_check(this,dim,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return *(ssize_t *)((this->super_buffer).super_object.super_handle.m_ptr[2].ob_refcnt + dim * 8);
}

Assistant:

ssize_t shape(ssize_t dim) const {
        if (dim >= ndim())
            fail_dim_check(dim, "invalid axis");
        return shape()[dim];
    }